

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printMemReference(MCInst *MI,uint Op,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  uint uVar3;
  MCOperand *pMVar4;
  MCOperand *op;
  MCOperand *op_00;
  MCOperand *op_01;
  uint8_t *puVar5;
  ulong uVar6;
  int64_t iVar7;
  int64_t DispVal;
  int reg;
  uint64_t ScaleVal;
  MCOperand *SegReg;
  MCOperand *DispSpec;
  MCOperand *IndexReg;
  MCOperand *BaseReg;
  SStream *O_local;
  uint Op_local;
  MCInst *MI_local;
  
  pMVar4 = MCInst_getOperand(MI,Op);
  op = MCInst_getOperand(MI,Op + 2);
  op_00 = MCInst_getOperand(MI,Op + 3);
  op_01 = MCInst_getOperand(MI,Op + 4);
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar5 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x3e;
    puVar5[0] = '\x03';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    MI->flat_insn->detail->groups
    [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] = MI->x86opsize;
    puVar5 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    uVar3 = MCOperand_getReg(pMVar4);
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x4a) = uVar3;
    uVar3 = MCOperand_getReg(op);
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x4e) = uVar3;
    puVar5 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x52;
    puVar5[0] = '\x01';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x56;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
  }
  uVar3 = MCOperand_getReg(op_01);
  if (uVar3 != 0) {
    _printOperand(MI,Op + 4,O);
    if (MI->csh->detail != CS_OPT_OFF) {
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46) = uVar3;
    }
    SStream_concat0(O,":");
  }
  _Var2 = MCOperand_isImm(op_00);
  if (_Var2) {
    uVar6 = MCOperand_getImm(op_00);
    if (MI->csh->detail != CS_OPT_OFF) {
      *(ulong *)(MI->flat_insn->detail->groups +
                (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x56) = uVar6;
    }
    if (uVar6 != 0) {
      uVar3 = MCOperand_getReg(op);
      if ((uVar3 == 0) && (uVar3 = MCOperand_getReg(pMVar4), uVar3 == 0)) {
        if ((long)uVar6 < 0) {
          SStream_concat(O,"0x%lx",arch_masks[MI->csh->mode] & uVar6);
        }
        else if ((long)uVar6 < 10) {
          SStream_concat(O,"%lu",uVar6);
        }
        else {
          SStream_concat(O,"0x%lx",uVar6);
        }
      }
      else if ((long)uVar6 < 0) {
        if ((long)uVar6 < -9) {
          SStream_concat(O,"-0x%lx",-uVar6);
        }
        else {
          SStream_concat(O,"-%lu",-uVar6);
        }
      }
      else if ((long)uVar6 < 10) {
        SStream_concat(O,"%lu",uVar6);
      }
      else {
        SStream_concat(O,"0x%lx",uVar6);
      }
    }
  }
  uVar3 = MCOperand_getReg(op);
  if ((uVar3 != 0) || (uVar3 = MCOperand_getReg(pMVar4), uVar3 != 0)) {
    SStream_concat0(O,"(");
    uVar3 = MCOperand_getReg(pMVar4);
    if (uVar3 != 0) {
      _printOperand(MI,Op,O);
    }
    uVar3 = MCOperand_getReg(op);
    if (uVar3 != 0) {
      SStream_concat0(O,", ");
      _printOperand(MI,Op + 2,O);
      pMVar4 = MCInst_getOperand(MI,Op + 1);
      iVar7 = MCOperand_getImm(pMVar4);
      if (MI->csh->detail != CS_OPT_OFF) {
        *(int *)(MI->flat_insn->detail->groups +
                (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x52) = (int)iVar7;
      }
      if (iVar7 != 1) {
        SStream_concat(O,", %u",iVar7);
      }
    }
    SStream_concat0(O,")");
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar1 = MI->flat_insn->detail;
    (pcVar1->field_6).x86.op_count = (pcVar1->field_6).x86.op_count + '\x01';
  }
  return;
}

Assistant:

static void printMemReference(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *BaseReg  = MCInst_getOperand(MI, Op + X86_AddrBaseReg);
	MCOperand *IndexReg  = MCInst_getOperand(MI, Op + X86_AddrIndexReg);
	MCOperand *DispSpec = MCInst_getOperand(MI, Op + X86_AddrDisp);
	MCOperand *SegReg = MCInst_getOperand(MI, Op + X86_AddrSegmentReg);
	uint64_t ScaleVal;
	int reg;

	if (MI->csh->detail) {
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->x86opsize;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = MCOperand_getReg(BaseReg);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.index = MCOperand_getReg(IndexReg);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = 1;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = 0;
	}

	// If this has a segment register, print it.
	reg = MCOperand_getReg(SegReg);
	if (reg) {
		_printOperand(MI, Op + X86_AddrSegmentReg, O);
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = reg;
		}

		SStream_concat0(O, ":");
	}

	if (MCOperand_isImm(DispSpec)) {
		int64_t DispVal = MCOperand_getImm(DispSpec);
		if (MI->csh->detail)
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = DispVal;
		if (DispVal) {
			if (MCOperand_getReg(IndexReg) || MCOperand_getReg(BaseReg)) {
				if (DispVal < 0) {
					if (DispVal <  -HEX_THRESHOLD)
						SStream_concat(O, "-0x%"PRIx64, -DispVal);
					else
						SStream_concat(O, "-%"PRIu64, -DispVal);
				} else {
					if (DispVal > HEX_THRESHOLD)
						SStream_concat(O, "0x%"PRIx64, DispVal);
					else
						SStream_concat(O, "%"PRIu64, DispVal);
				}
			} else {
				// only immediate as address of memory
				if (DispVal < 0) {
					SStream_concat(O, "0x%"PRIx64, arch_masks[MI->csh->mode] & DispVal);
				} else {
					if (DispVal > HEX_THRESHOLD)
						SStream_concat(O, "0x%"PRIx64, DispVal);
					else
						SStream_concat(O, "%"PRIu64, DispVal);
				}
			}
		}
	}

	if (MCOperand_getReg(IndexReg) || MCOperand_getReg(BaseReg)) {
		SStream_concat0(O, "(");

		if (MCOperand_getReg(BaseReg))
			_printOperand(MI, Op + X86_AddrBaseReg, O);

		if (MCOperand_getReg(IndexReg)) {
			SStream_concat0(O, ", ");
			_printOperand(MI, Op + X86_AddrIndexReg, O);
			ScaleVal = MCOperand_getImm(MCInst_getOperand(MI, Op + X86_AddrScaleAmt));
			if (MI->csh->detail)
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = (int)ScaleVal;
			if (ScaleVal != 1) {
				SStream_concat(O, ", %u", ScaleVal);
			}
		}
		SStream_concat0(O, ")");
	}

	if (MI->csh->detail)
		MI->flat_insn->detail->x86.op_count++;
}